

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.h
# Opt level: O2

void __thiscall
chrono::fea::ChLoadXYZROTnodeXYZROTnode::ChLoadXYZROTnodeXYZROTnode
          (ChLoadXYZROTnodeXYZROTnode *this,ChLoadXYZROTnodeXYZROTnode *param_1)

{
  ChLoadCustomMultiple::ChLoadCustomMultiple
            (&this->super_ChLoadCustomMultiple,&param_1->super_ChLoadCustomMultiple);
  (this->super_ChLoadCustomMultiple).super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadXYZROTnodeXYZROTnode_01176e80;
  ChFrame<double>::ChFrame(&this->loc_application_A,&param_1->loc_application_A);
  ChFrame<double>::ChFrame(&this->loc_application_B,&param_1->loc_application_B);
  (this->locB_force).m_data[0] = (param_1->locB_force).m_data[0];
  (this->locB_force).m_data[1] = (param_1->locB_force).m_data[1];
  (this->locB_force).m_data[2] = (param_1->locB_force).m_data[2];
  (this->locB_torque).m_data[0] = (param_1->locB_torque).m_data[0];
  (this->locB_torque).m_data[1] = (param_1->locB_torque).m_data[1];
  (this->locB_torque).m_data[2] = (param_1->locB_torque).m_data[2];
  ChFrameMoving<double>::ChFrameMoving(&this->frame_Aw,&param_1->frame_Aw);
  ChFrameMoving<double>::ChFrameMoving(&this->frame_Bw,&param_1->frame_Bw);
  return;
}

Assistant:

class ChApi ChLoadXYZROTnodeXYZROTnode : public ChLoadCustomMultiple {
  public:
    ChLoadXYZROTnodeXYZROTnode(std::shared_ptr<ChNodeFEAxyzrot> mnodeA,  ///< node A to apply load to
                               std::shared_ptr<ChNodeFEAxyzrot> mnodeB,  ///< node B to apply load to, as reaction
                               const ChFrame<>& abs_application  ///< location of load element (in abs. coordinates)
    );

    /// Compute the wrench (force & torque) between the two nodes, expressed in local frame of loc_application_B,
    /// given rel_AB, i.e. the position and speed of loc_application_A respect to loc_application_B, expressed in frame
    /// of loc_application_B. Force is assumed applied to loc_application_B, and its opposite reaction to A. Inherited
    /// classes MUST IMPLEMENT THIS.
    virtual void ComputeForceTorque(const ChFrameMoving<>& rel_AB, ChVector<>& loc_force, ChVector<>& loc_torque) = 0;

    /// Compute Q, the generalized load.
    /// Called automatically at each Update().
    virtual void ComputeQ(ChState* state_x,      ///< state position to evaluate Q
                          ChStateDelta* state_w  ///< state speed to evaluate Q
                          ) override;

    // Optional: inherited classes could implement this to avoid the
    // default numerical computation of jacobians:
    //   virtual void ComputeJacobian(...) // see ChLoad

    /// For diagnosis purposes, this can return the actual last computed value of
    /// the applied force, expressed in coordinate system of loc_application_B, assumed applied to body B
    ChVector<> GetForce() const { return locB_force; }

    /// For diagnosis purposes, this can return the actual last computed value of
    /// the applied torque, expressed in coordinate system of loc_application_B, assumed applied to body B
    ChVector<> GetTorque() const { return locB_torque; }

    /// Set the application frame of bushing on bodyA
    void SetApplicationFrameA(const ChFrame<>& mpA) { loc_application_A = mpA; }
    ChFrame<> GetApplicationFrameA() const { return loc_application_A; }

    /// Set the application frame of bushing on bodyB
    void SetApplicationFrameB(const ChFrame<>& mpB) { loc_application_B = mpB; }
    ChFrame<> GetApplicationFrameB() const { return loc_application_B; }

    /// Get absolute coordinate of frame A (last computed)
    ChFrameMoving<> GetAbsoluteFrameA() const { return frame_Aw; }

    /// Get absolute coordinate of frame B (last computed)
    ChFrameMoving<> GetAbsoluteFrameB() const { return frame_Bw; }

    std::shared_ptr<ChNodeFEAxyzrot> GetNodeA() const;
    std::shared_ptr<ChNodeFEAxyzrot> GetNodeB() const;

  protected:
    ChFrame<> loc_application_A;  ///< application point on body A (local)
    ChFrame<> loc_application_B;  ///< application point on body B (local)
    ChVector<> locB_force;        ///< store computed values here
    ChVector<> locB_torque;       ///< store computed values here
    ChFrameMoving<> frame_Aw;     ///< for results
    ChFrameMoving<> frame_Bw;     ///< for results
}